

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

void __thiscall libtorrent::dht::rpc_manager::add_our_id(rpc_manager *this,entry *e)

{
  undefined8 uVar1;
  entry *this_00;
  string_view key;
  size_type __dnew;
  string_type local_50;
  size_type local_30;
  
  local_30 = 0x14;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
  local_50.field_2._M_allocated_capacity = local_30;
  *(uint *)(local_50._M_dataplus._M_p + 0x10) = (this->m_our_id).m_number._M_elems[4];
  uVar1 = *(undefined8 *)((this->m_our_id).m_number._M_elems + 2);
  *(undefined8 *)local_50._M_dataplus._M_p = *(undefined8 *)(this->m_our_id).m_number._M_elems;
  *(undefined8 *)(local_50._M_dataplus._M_p + 8) = uVar1;
  local_50._M_string_length = local_30;
  local_50._M_dataplus._M_p[local_30] = '\0';
  key._M_str = "id";
  key._M_len = 2;
  this_00 = entry::operator[](e,key);
  entry::operator=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void rpc_manager::add_our_id(entry& e)
{
	e["id"] = m_our_id.to_string();
}